

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.h
# Opt level: O3

bool CoreML::Specification::operator==(OneHotEncoder *a,OneHotEncoder *b)

{
  uint32 uVar1;
  bool bVar2;
  
  uVar1 = a->_oneof_case_[0];
  if (uVar1 != b->_oneof_case_[0]) {
    return false;
  }
  if (uVar1 == 1) {
    bVar2 = vectorsEqual<CoreML::Specification::StringVector>
                      ((a->CategoryType_).stringcategories_,(b->CategoryType_).stringcategories_);
  }
  else {
    if (uVar1 != 2) goto LAB_002abd0b;
    bVar2 = vectorsEqual<CoreML::Specification::Int64Vector>
                      ((a->CategoryType_).int64categories_,(b->CategoryType_).int64categories_);
  }
  if (bVar2 == false) {
    return false;
  }
LAB_002abd0b:
  if (a->outputsparse_ != b->outputsparse_) {
    return false;
  }
  return a->handleunknown_ == b->handleunknown_;
}

Assistant:

inline OneHotEncoder::CategoryTypeCase OneHotEncoder::CategoryType_case() const {
  return OneHotEncoder::CategoryTypeCase(_oneof_case_[0]);
}